

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall
Darts::Details::AutoPool<unsigned_int>::resize_buf(AutoPool<unsigned_int> *this,size_t size)

{
  char *pcVar1;
  char *pcVar2;
  ulong local_58;
  size_t i;
  uint *dest;
  uint *src;
  bad_alloc *anon_var_0;
  AutoArray<char> local_28;
  AutoArray<char> buf;
  size_t capacity;
  size_t size_local;
  AutoPool<unsigned_int> *this_local;
  
  buf.array_ = (char *)size;
  if (size < this->capacity_ << 1) {
    for (buf.array_ = (char *)0x1; buf.array_ < size; buf.array_ = buf.array_ << 1) {
    }
  }
  AutoArray<char>::AutoArray(&local_28,(char *)0x0);
  pcVar1 = (char *)operator_new__((long)buf.array_ << 2);
  AutoArray<char>::reset(&local_28,pcVar1);
  if (this->size_ != 0) {
    pcVar1 = AutoArray<char>::operator[](&this->buf_,0);
    pcVar2 = AutoArray<char>::operator[](&local_28,0);
    for (local_58 = 0; local_58 < this->size_; local_58 = local_58 + 1) {
      *(undefined4 *)(pcVar2 + local_58 * 4) = *(undefined4 *)(pcVar1 + local_58 * 4);
    }
  }
  AutoArray<char>::swap(&this->buf_,&local_28);
  this->capacity_ = (size_t)buf.array_;
  AutoArray<char>::~AutoArray(&local_28);
  return;
}

Assistant:

void AutoPool<T>::resize_buf(std::size_t size) {
  std::size_t capacity;
  if (size >= capacity_ * 2) {
    capacity = size;
  } else {
    capacity = 1;
    while (capacity < size) {
      capacity <<= 1;
    }
  }

  AutoArray<char> buf;
  try {
    buf.reset(new char[sizeof(T) * capacity]);
  } catch (const std::bad_alloc &) {
    DARTS_THROW("failed to resize pool: std::bad_alloc");
  }

  if (size_ > 0) {
    T *src = reinterpret_cast<T *>(&buf_[0]);
    T *dest = reinterpret_cast<T *>(&buf[0]);
    for (std::size_t i = 0; i < size_; ++i) {
      new(&dest[i]) T(src[i]);
      src[i].~T();
    }
  }

  buf_.swap(&buf);
  capacity_ = capacity;
}